

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O2

void __thiscall pstore::broker::gc_watch_thread::watcher(gc_watch_thread *this)

{
  int iVar1;
  process_bimap *ppVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int *piVar4;
  _Base_ptr p_Var5;
  uint d;
  char *pcVar6;
  double __x;
  double __x_00;
  double __x_01;
  int status;
  allocator local_1bf;
  allocator local_1be;
  allocator local_1bd;
  __pid_t pid;
  gc_watch_thread *local_1b8;
  not_null<const_char_*> local_1a8;
  descriptor_condition_variable *local_1a0;
  unique_lock<std::mutex> lock;
  not_null<const_char_*> local_188;
  not_null<const_char_*> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char errbuf [256];
  
  local_180.ptr_ = "starting gc process watch thread";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_180);
  log((pstore *)0x6,__x);
  register_signal_handler(0x11,child_signal);
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mut_);
  local_1a0 = &(this->cv_).cv_;
  local_1b8 = this;
LAB_0011a039:
  do {
    local_1a8.ptr_ = "waiting for a GC process to complete";
    pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_1a8);
    log((pstore *)0x6,__x_00);
    descriptor_condition_variable::wait(local_1a0,&lock);
    if (local_1b8->done_ != false) {
      local_188.ptr_ = "cleaning up";
      pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_188);
      log((pstore *)0x6,__x_01);
      ppVar2 = &local_1b8->processes_;
      for (p_Var5 = (local_1b8->processes_).right_._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var5 != &(ppVar2->right_)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        status = p_Var5[1]._M_color;
        (*local_1b8->_vptr_gc_watch_thread[3])(local_1b8,&status);
      }
      std::unique_lock<std::mutex>::~unique_lock(&lock);
      return;
    }
    status = 0;
    while( true ) {
      pid = waitpid(-1,&status,3);
      if (pid == -1) break;
      if (pid == 0) goto LAB_0011a039;
      pbVar3 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
               ::getl(&this->processes_,&pid);
      std::__cxx11::string::string((string *)&local_158,(string *)pbVar3);
      log<std::__cxx11::string>(info,"GC exited for ",&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      iVar1 = status;
      log<int>(info,"GC process exited pid ",pid);
      pcVar6 = "Normal termination, exit status = ";
      d = iVar1 & 0x7f;
      if (d == 0) {
LAB_0011a144:
        log<int>(info,pcVar6,(uint)iVar1 >> 8 & 0xff);
      }
      else if ((int)(d * 0x1000000 + 0x1000000) < 0x2000000) {
        pcVar6 = "Child stopped, signal number = ";
        if ((char)iVar1 == '\x7f') goto LAB_0011a144;
      }
      else {
        log<int>(info,"Abormal termination, signal number ",d);
        pcVar6 = "(core file generated)";
        if (-1 < (char)iVar1) {
          pcVar6 = "(no core file available)";
        }
        log<char_const*>(info,"  ",pcVar6);
      }
      bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
      ::eraser<int>(&this->processes_,&pid);
    }
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    if (iVar1 != 10) {
      errbuf[0] = '\0';
      *piVar4 = 0;
      pcVar6 = strerror_r(iVar1,errbuf,0x100);
      if (*piVar4 == 0) {
        if (*pcVar6 == '\0') {
          std::__cxx11::string::string((string *)&local_178,"[empty string returned]",&local_1be);
        }
        else {
          std::__cxx11::string::string((string *)&local_178,pcVar6,&local_1bf);
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_178,"[unable to get message]",&local_1bd);
      }
      log<std::__cxx11::string>(error,"waitpid error: ",&local_178);
      std::__cxx11::string::~string((string *)&local_178);
    }
  } while( true );
}

Assistant:

void gc_watch_thread::watcher () {
            log (priority::info, "starting gc process watch thread");

            // Installing a global signal handler here is really somewhat antisocial. It would
            // overwrite a similar handler from another part of the system and it continues to be
            // active once this function returns.
            //
            // However, I'm comfortable enough with it at the moment that a more complex solution
            // is unnessary.
            register_signal_handler (SIGCHLD, &child_signal);

            std::unique_lock<decltype (mut_)> lock (mut_);
            for (;;) {
                try {
                    log (priority::info, "waiting for a GC process to complete");
                    cv_.wait (lock);
                    // There are two reasons that we may have been woken:
                    // - One (or more) of our child processes may have exited.
                    // - The program is exiting.
                    if (done_) {
                        break;
                    }

                    // Loop to ensure that we query all processes that exited whilst we were
                    // waiting.
                    auto status = 0;
                    while (auto const pid = ::waitpid (-1, &status, WUNTRACED | WNOHANG)) {
                        if (pid == -1) {
                            int const err = errno;
                            // If the error was "no child processes", we shouldn't report it.
                            if (err != ECHILD) {
                                log (priority::error, "waitpid error: ", string_error (err));
                            }
                            break;
                        }

                        std::string const & db_path = processes_.getl (pid);
                        log (priority::info, "GC exited for ", db_path);
                        // TODO: push a message to a channel which will tell a listener that this GC
                        // process has exited (and why)

                        pr_exit (pid, status); // Log the process exit.

                        processes_.eraser (pid); // Forget about the process.
                    }
                } catch (std::exception const & ex) {
                    log (priority::error, "An error occurred: ", ex.what ());
                    // TODO: delay before restarting. Don't restart after e.g. bad_alloc?
                } catch (...) {
                    log (priority::error, "Unknown error");
                    // TODO: delay before restarting
                }
            }

            // Ask any child GC processes to quit.
            log (priority::info, "cleaning up");
            std::for_each (processes_.right_begin (), processes_.right_end (),
                           [this] (pid_t const pid) { this->kill (pid); });
        }